

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O2

double __thiscall
HighsLinearSumBounds::getResidualSumLowerOrig
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient)

{
  int iVar1;
  pointer pHVar2;
  double *pdVar3;
  double dVar4;
  HighsCDouble HVar5;
  
  iVar1 = (this->numInfSumLowerOrig).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[sum];
  dVar4 = -INFINITY;
  if (iVar1 == 1) {
    if (coefficient <= 0.0) {
      if (this->varUpper[var] < INFINITY) {
        return -INFINITY;
      }
    }
    else if (-INFINITY < this->varLower[var]) {
      return -INFINITY;
    }
    pHVar2 = (this->sumLowerOrig).super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>.
             _M_impl.super__Vector_impl_data._M_start;
    dVar4 = pHVar2[sum].hi + pHVar2[sum].lo;
  }
  else if (iVar1 == 0) {
    if (coefficient <= 0.0) {
      pdVar3 = this->varUpper;
    }
    else {
      pdVar3 = this->varLower;
    }
    HVar5 = HighsCDouble::operator-
                      ((this->sumLowerOrig).
                       super__Vector_base<HighsCDouble,_std::allocator<HighsCDouble>_>._M_impl.
                       super__Vector_impl_data._M_start + sum,coefficient * pdVar3[var]);
    dVar4 = HVar5.lo + HVar5.hi;
  }
  return dVar4;
}

Assistant:

double HighsLinearSumBounds::getResidualSumLowerOrig(HighsInt sum, HighsInt var,
                                                     double coefficient) const {
  switch (numInfSumLowerOrig[sum]) {
    case 0:
      if (coefficient > 0)
        return double(sumLowerOrig[sum] - varLower[var] * coefficient);
      else
        return double(sumLowerOrig[sum] - varUpper[var] * coefficient);
      break;
    case 1:
      if (coefficient > 0)
        return varLower[var] == -kHighsInf ? double(sumLowerOrig[sum])
                                           : -kHighsInf;
      else
        return varUpper[var] == kHighsInf ? double(sumLowerOrig[sum])
                                          : -kHighsInf;
      break;
    default:
      return -kHighsInf;
  }
}